

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O2

bool cmCTestScriptHandler::EmptyBinaryDirectory(string *sname)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  string check;
  cmAlphaNum local_80;
  cmAlphaNum local_50;
  
  if (sname->_M_string_length < 2) {
    bVar3 = false;
  }
  else {
    bVar1 = cmsys::SystemTools::FileExists(sname);
    bVar3 = true;
    if (bVar1) {
      local_50.View_._M_str = (sname->_M_dataplus)._M_p;
      local_50.View_._M_len = sname->_M_string_length;
      local_80.View_._M_len = 0xf;
      local_80.View_._M_str = "/CMakeCache.txt";
      cmStrCat<>(&check,&local_50,&local_80);
      bVar1 = cmsys::SystemTools::FileExists(&check);
      if (bVar1) {
        iVar2 = 5;
        while( true ) {
          bVar3 = iVar2 != 0;
          iVar2 = iVar2 + -1;
          if (!bVar3) break;
          bVar1 = TryToRemoveBinaryDirectoryOnce(sname);
          if (bVar1) break;
          cmsys::SystemTools::Delay(100);
        }
      }
      else {
        bVar3 = false;
      }
      std::__cxx11::string::~string((string *)&check);
    }
  }
  return bVar3;
}

Assistant:

bool cmCTestScriptHandler::EmptyBinaryDirectory(const std::string& sname)
{
  // try to avoid deleting root
  if (sname.size() < 2) {
    return false;
  }

  // consider non existing target directory a success
  if (!cmSystemTools::FileExists(sname)) {
    return true;
  }

  // try to avoid deleting directories that we shouldn't
  std::string check = cmStrCat(sname, "/CMakeCache.txt");

  if (!cmSystemTools::FileExists(check)) {
    return false;
  }

  for (int i = 0; i < 5; ++i) {
    if (TryToRemoveBinaryDirectoryOnce(sname)) {
      return true;
    }
    cmSystemTools::Delay(100);
  }

  return false;
}